

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O1

bool QDockWidgetLayout::wmSupportsNativeWindowDeco(void)

{
  if (wmSupportsNativeWindowDeco()::xcb == '\0') {
    wmSupportsNativeWindowDeco();
  }
  if (wmSupportsNativeWindowDeco()::wayland == '\0') {
    wmSupportsNativeWindowDeco();
  }
  return (bool)(~(wmSupportsNativeWindowDeco::wayland | wmSupportsNativeWindowDeco::xcb) & 1);
}

Assistant:

bool QDockWidgetLayout::wmSupportsNativeWindowDeco()
{
#if defined(Q_OS_ANDROID)
    return false;
#else
    static const bool xcb = !QGuiApplication::platformName().compare("xcb"_L1, Qt::CaseInsensitive);
    static const bool wayland =
            QGuiApplication::platformName().startsWith("wayland"_L1, Qt::CaseInsensitive);
    return !(xcb || wayland);
#endif
}